

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgStatement.cpp
# Opt level: O3

void __thiscall
rsg::ConditionalStatement::tokenize
          (ConditionalStatement *this,GeneratorState *state,TokenStream *str)

{
  long lVar1;
  _func_int **pp_Var2;
  pointer pTVar3;
  size_t sVar4;
  Statement *pSVar5;
  size_t sVar6;
  Token local_40;
  Token local_30;
  
  local_40.m_type = IF;
  pTVar3 = (str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
           super__Vector_impl_data._M_start;
  sVar4 = (long)(str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)pTVar3 >> 4;
  sVar6 = str->m_numTokens;
  if (sVar4 == sVar6) {
    std::vector<rsg::Token,_std::allocator<rsg::Token>_>::resize(&str->m_tokens,sVar4 + 0x40);
    pTVar3 = (str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
             super__Vector_impl_data._M_start;
    sVar6 = str->m_numTokens;
  }
  Token::operator=(pTVar3 + sVar6,&local_40);
  sVar4 = str->m_numTokens;
  sVar6 = sVar4 + 1;
  str->m_numTokens = sVar6;
  local_30.m_type = LEFT_PAREN;
  pTVar3 = (str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((long)(str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
            super__Vector_impl_data._M_finish - (long)pTVar3 >> 4 == sVar6) {
    std::vector<rsg::Token,_std::allocator<rsg::Token>_>::resize(&str->m_tokens,sVar4 + 0x41);
    pTVar3 = (str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
             super__Vector_impl_data._M_start;
    sVar6 = str->m_numTokens;
  }
  Token::operator=(pTVar3 + sVar6,&local_30);
  str->m_numTokens = str->m_numTokens + 1;
  Token::~Token(&local_30);
  Token::~Token(&local_40);
  (*this->m_condition->_vptr_Expression[3])(this->m_condition,state,str);
  local_40.m_type = RIGHT_PAREN;
  pTVar3 = (str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
           super__Vector_impl_data._M_start;
  sVar4 = (long)(str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)pTVar3 >> 4;
  sVar6 = str->m_numTokens;
  if (sVar4 == sVar6) {
    std::vector<rsg::Token,_std::allocator<rsg::Token>_>::resize(&str->m_tokens,sVar4 + 0x40);
    pTVar3 = (str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
             super__Vector_impl_data._M_start;
    sVar6 = str->m_numTokens;
  }
  Token::operator=(pTVar3 + sVar6,&local_40);
  sVar4 = str->m_numTokens;
  sVar6 = sVar4 + 1;
  str->m_numTokens = sVar6;
  local_30.m_type = NEWLINE;
  pTVar3 = (str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((long)(str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
            super__Vector_impl_data._M_finish - (long)pTVar3 >> 4 == sVar6) {
    std::vector<rsg::Token,_std::allocator<rsg::Token>_>::resize(&str->m_tokens,sVar4 + 0x41);
    pTVar3 = (str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
             super__Vector_impl_data._M_start;
    sVar6 = str->m_numTokens;
  }
  Token::operator=(pTVar3 + sVar6,&local_30);
  str->m_numTokens = str->m_numTokens + 1;
  Token::~Token(&local_30);
  Token::~Token(&local_40);
  pSVar5 = this->m_trueStatement;
  if ((pSVar5 == (Statement *)0x0) ||
     (lVar1 = __dynamic_cast(pSVar5,&Statement::typeinfo,&BlockStatement::typeinfo,0), lVar1 == 0))
  {
    local_40.m_type = INDENT_INC;
    pTVar3 = (str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
             super__Vector_impl_data._M_start;
    sVar4 = (long)(str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>.
                  _M_impl.super__Vector_impl_data._M_finish - (long)pTVar3 >> 4;
    sVar6 = str->m_numTokens;
    if (sVar4 == sVar6) {
      std::vector<rsg::Token,_std::allocator<rsg::Token>_>::resize(&str->m_tokens,sVar4 + 0x40);
      pTVar3 = (str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
               super__Vector_impl_data._M_start;
      sVar6 = str->m_numTokens;
    }
    Token::operator=(pTVar3 + sVar6,&local_40);
    str->m_numTokens = str->m_numTokens + 1;
    Token::~Token(&local_40);
    (*this->m_trueStatement->_vptr_Statement[3])(this->m_trueStatement,state,str);
    local_40.m_type = INDENT_DEC;
    pTVar3 = (str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
             super__Vector_impl_data._M_start;
    sVar4 = (long)(str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>.
                  _M_impl.super__Vector_impl_data._M_finish - (long)pTVar3 >> 4;
    sVar6 = str->m_numTokens;
    if (sVar4 == sVar6) {
      std::vector<rsg::Token,_std::allocator<rsg::Token>_>::resize(&str->m_tokens,sVar4 + 0x40);
      pTVar3 = (str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
               super__Vector_impl_data._M_start;
      sVar6 = str->m_numTokens;
    }
    Token::operator=(pTVar3 + sVar6,&local_40);
    str->m_numTokens = str->m_numTokens + 1;
    Token::~Token(&local_40);
  }
  else {
    (*pSVar5->_vptr_Statement[3])(pSVar5,state,str);
  }
  if (this->m_falseStatement == (Statement *)0x0) {
    return;
  }
  local_40.m_type = ELSE;
  pTVar3 = (str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
           super__Vector_impl_data._M_start;
  sVar4 = (long)(str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)pTVar3 >> 4;
  sVar6 = str->m_numTokens;
  if (sVar4 == sVar6) {
    std::vector<rsg::Token,_std::allocator<rsg::Token>_>::resize(&str->m_tokens,sVar4 + 0x40);
    pTVar3 = (str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
             super__Vector_impl_data._M_start;
    sVar6 = str->m_numTokens;
  }
  Token::operator=(pTVar3 + sVar6,&local_40);
  str->m_numTokens = str->m_numTokens + 1;
  Token::~Token(&local_40);
  pSVar5 = this->m_falseStatement;
  if (pSVar5 == (Statement *)0x0) {
LAB_0197748d:
    local_40.m_type = NEWLINE;
    pTVar3 = (str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
             super__Vector_impl_data._M_start;
    sVar4 = (long)(str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>.
                  _M_impl.super__Vector_impl_data._M_finish - (long)pTVar3 >> 4;
    sVar6 = str->m_numTokens;
    if (sVar4 == sVar6) {
      std::vector<rsg::Token,_std::allocator<rsg::Token>_>::resize(&str->m_tokens,sVar4 + 0x40);
      pTVar3 = (str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
               super__Vector_impl_data._M_start;
      sVar6 = str->m_numTokens;
    }
    Token::operator=(pTVar3 + sVar6,&local_40);
    sVar4 = str->m_numTokens;
    sVar6 = sVar4 + 1;
    str->m_numTokens = sVar6;
    local_30.m_type = INDENT_INC;
    pTVar3 = (str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((long)(str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
              super__Vector_impl_data._M_finish - (long)pTVar3 >> 4 == sVar6) {
      std::vector<rsg::Token,_std::allocator<rsg::Token>_>::resize(&str->m_tokens,sVar4 + 0x41);
      pTVar3 = (str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
               super__Vector_impl_data._M_start;
      sVar6 = str->m_numTokens;
    }
    Token::operator=(pTVar3 + sVar6,&local_30);
    str->m_numTokens = str->m_numTokens + 1;
    Token::~Token(&local_30);
    Token::~Token(&local_40);
    (*this->m_falseStatement->_vptr_Statement[3])(this->m_falseStatement,state,str);
    local_40.m_type = INDENT_DEC;
    pTVar3 = (str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
             super__Vector_impl_data._M_start;
    sVar4 = (long)(str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>.
                  _M_impl.super__Vector_impl_data._M_finish - (long)pTVar3 >> 4;
    sVar6 = str->m_numTokens;
    if (sVar4 == sVar6) {
      std::vector<rsg::Token,_std::allocator<rsg::Token>_>::resize(&str->m_tokens,sVar4 + 0x40);
      pTVar3 = (str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
               super__Vector_impl_data._M_start;
      sVar6 = str->m_numTokens;
    }
    Token::operator=(pTVar3 + sVar6,&local_40);
    str->m_numTokens = str->m_numTokens + 1;
    Token::~Token(&local_40);
  }
  else {
    lVar1 = __dynamic_cast(pSVar5,&Statement::typeinfo,&typeinfo,0);
    if (lVar1 == 0) {
      lVar1 = __dynamic_cast(pSVar5,&Statement::typeinfo,&BlockStatement::typeinfo,0);
      if (lVar1 == 0) goto LAB_0197748d;
      local_40.m_type = NEWLINE;
      pTVar3 = (str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
               super__Vector_impl_data._M_start;
      sVar4 = (long)(str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>.
                    _M_impl.super__Vector_impl_data._M_finish - (long)pTVar3 >> 4;
      sVar6 = str->m_numTokens;
      if (sVar4 == sVar6) {
        std::vector<rsg::Token,_std::allocator<rsg::Token>_>::resize(&str->m_tokens,sVar4 + 0x40);
        pTVar3 = (str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl
                 .super__Vector_impl_data._M_start;
        sVar6 = str->m_numTokens;
      }
      Token::operator=(pTVar3 + sVar6,&local_40);
      str->m_numTokens = str->m_numTokens + 1;
      Token::~Token(&local_40);
      pSVar5 = this->m_falseStatement;
      pp_Var2 = pSVar5->_vptr_Statement;
    }
    else {
      pp_Var2 = pSVar5->_vptr_Statement;
    }
    (*pp_Var2[3])(pSVar5,state,str);
  }
  return;
}

Assistant:

void ConditionalStatement::tokenize (GeneratorState& state, TokenStream& str) const
{
	DE_ASSERT(m_condition && m_trueStatement);

	// if (condition)
	str << Token::IF << Token::LEFT_PAREN;
	m_condition->tokenize(state, str);
	str << Token::RIGHT_PAREN << Token::NEWLINE;

	// Statement executed if true
	if (!isBlockStatement(m_trueStatement))
	{
		str << Token::INDENT_INC;
		m_trueStatement->tokenize(state, str);
		str << Token::INDENT_DEC;
	}
	else
		m_trueStatement->tokenize(state, str);

	if (m_falseStatement)
	{
		str << Token::ELSE;

		if (isConditionalStatement(m_falseStatement))
		{
			m_falseStatement->tokenize(state, str);
		}
		else if (isBlockStatement(m_falseStatement))
		{
			str << Token::NEWLINE;
			m_falseStatement->tokenize(state, str);
		}
		else
		{
			str << Token::NEWLINE << Token::INDENT_INC;
			m_falseStatement->tokenize(state, str);
			str << Token::INDENT_DEC;
		}
	}
}